

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O1

void display_record(dota_record *r)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player [",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(r->name)._M_dataplus._M_p,(r->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] win [",7);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,r->win);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] games in [",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,r->played);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] plays at a rate of [",0x16);
  poVar1 = std::ostream::_M_insert<double>((double)r->rate);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%].\n",4);
  return;
}

Assistant:

void display_record (const dota_record & r) {
    std::cout << "Player [" << r.name << "] win [" << r.win << "] games in [" << r.played << "] plays at a rate of [" << r.rate << "%].\n";
}